

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O2

SUNMatrix SUNSparseFromBandMatrix(SUNMatrix Ab,sunrealtype droptol,int sparsetype)

{
  long *plVar1;
  long M;
  long N;
  void *pvVar2;
  void *pvVar3;
  SUNMatrix p_Var4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  plVar1 = (long *)Ab->content;
  M = *plVar1;
  N = plVar1[1];
  lVar8 = 0;
  if (0 < N) {
    lVar8 = N;
  }
  lVar7 = 0;
  lVar5 = 0;
  for (lVar9 = 0; lVar9 != lVar8; lVar9 = lVar9 + 1) {
    lVar10 = lVar9 - plVar1[3];
    if (lVar9 - plVar1[3] < 1) {
      lVar10 = 0;
    }
    lVar11 = plVar1[4] + lVar9;
    if (M <= plVar1[4] + lVar9) {
      lVar11 = M + -1;
    }
    for (; lVar10 <= lVar11; lVar10 = lVar10 + 1) {
      lVar5 = lVar5 + (ulong)(droptol <
                             ABS(*(double *)
                                  (plVar1[5] * 8 + *(long *)(plVar1[8] + lVar9 * 8) + lVar7 +
                                  lVar10 * 8)));
    }
    lVar7 = lVar7 + -8;
  }
  p_Var4 = SUNSparseMatrix(M,N,lVar5,sparsetype,Ab->sunctx);
  if (sparsetype == 0) {
    lVar7 = 0;
    lVar5 = 0;
    for (lVar9 = 0; lVar10 = N, lVar9 != lVar8; lVar9 = lVar9 + 1) {
      pvVar2 = p_Var4->content;
      *(long *)(*(long *)((long)pvVar2 + 0x38) + lVar9 * 8) = lVar5;
      pvVar3 = Ab->content;
      lVar10 = lVar9 - *(long *)((long)pvVar3 + 0x18);
      if (lVar10 < 1) {
        lVar10 = 0;
      }
      lVar11 = lVar10 + lVar7;
      while( true ) {
        lVar6 = *(long *)((long)pvVar3 + 0x20) + lVar9;
        if (M <= lVar6) {
          lVar6 = M + -1;
        }
        if (lVar6 < lVar10) break;
        lVar6 = *(long *)(*(long *)((long)pvVar3 + 0x40) + lVar9 * 8);
        if (droptol < ABS(*(double *)(*(long *)((long)pvVar3 + 0x28) * 8 + lVar6 + lVar11 * 8))) {
          *(long *)(*(long *)((long)pvVar2 + 0x30) + lVar5 * 8) = lVar10;
          *(undefined8 *)(*(long *)((long)pvVar2 + 0x20) + lVar5 * 8) =
               *(undefined8 *)(*(long *)((long)pvVar3 + 0x28) * 8 + lVar6 + lVar11 * 8);
          lVar5 = lVar5 + 1;
        }
        lVar10 = lVar10 + 1;
        lVar11 = lVar11 + 1;
      }
      lVar7 = lVar7 + -1;
    }
  }
  else {
    lVar8 = 0;
    if (0 < M) {
      lVar8 = M;
    }
    lVar7 = 0;
    lVar5 = 0;
    for (lVar9 = 0; lVar10 = M, lVar9 != lVar8; lVar9 = lVar9 + 1) {
      pvVar2 = p_Var4->content;
      *(long *)(*(long *)((long)pvVar2 + 0x38) + lVar9 * 8) = lVar5;
      pvVar3 = Ab->content;
      lVar10 = lVar9 - *(long *)((long)pvVar3 + 0x20);
      if (lVar10 < 1) {
        lVar10 = 0;
      }
      lVar11 = lVar7 + lVar10 * -8;
      while( true ) {
        lVar6 = *(long *)((long)pvVar3 + 0x18) + lVar9;
        if (N <= lVar6) {
          lVar6 = N + -1;
        }
        if (lVar6 < lVar10) break;
        lVar6 = *(long *)(*(long *)((long)pvVar3 + 0x40) + lVar10 * 8);
        if (droptol < ABS(*(double *)(lVar11 + *(long *)((long)pvVar3 + 0x28) * 8 + lVar6))) {
          *(long *)(*(long *)((long)pvVar2 + 0x30) + lVar5 * 8) = lVar10;
          *(undefined8 *)(*(long *)((long)pvVar2 + 0x20) + lVar5 * 8) =
               *(undefined8 *)(lVar11 + *(long *)((long)pvVar3 + 0x28) * 8 + lVar6);
          lVar5 = lVar5 + 1;
        }
        lVar10 = lVar10 + 1;
        lVar11 = lVar11 + -8;
      }
      lVar7 = lVar7 + 8;
    }
  }
  *(long *)(*(long *)((long)p_Var4->content + 0x38) + lVar10 * 8) = lVar5;
  return p_Var4;
}

Assistant:

SUNMatrix SUNSparseFromBandMatrix(SUNMatrix Ab, sunrealtype droptol,
                                  int sparsetype)
{
  SUNFunctionBegin(Ab->sunctx);
  sunindextype i, j, nnz;
  sunindextype M, N;
  SUNMatrix As;

  SUNAssertNull(SUNMatGetID(Ab) == SUNMATRIX_BAND, SUN_ERR_ARG_WRONGTYPE);
  SUNAssertNull(sparsetype == CSC_MAT || sparsetype == CSR_MAT,
                SUN_ERR_ARG_OUTOFRANGE);
  SUNAssertNull(droptol >= ZERO, SUN_ERR_ARG_OUTOFRANGE);

  /* set size of new matrix */
  M = SM_ROWS_B(Ab);
  N = SM_COLUMNS_B(Ab);

  /* determine total number of nonzeros */
  nnz = 0;
  for (j = 0; j < N; j++)
  {
    for (i = SUNMAX(0, j - SM_UBAND_B(Ab));
         i <= SUNMIN(M - 1, j + SM_LBAND_B(Ab)); i++)
    {
      nnz += (SUNRabs(SM_ELEMENT_B(Ab, i, j)) > droptol);
    }
  }

  /* allocate sparse matrix */
  As = SUNSparseMatrix(M, N, nnz, sparsetype, Ab->sunctx);
  SUNCheckLastErrNull();

  /* copy nonzeros from Ab into As, based on CSR/CSC type */
  nnz = 0;
  if (sparsetype == CSC_MAT)
  {
    for (j = 0; j < N; j++)
    {
      (SM_INDEXPTRS_S(As))[j] = nnz;
      for (i = SUNMAX(0, j - SM_UBAND_B(Ab));
           i <= SUNMIN(M - 1, j + SM_LBAND_B(Ab)); i++)
      {
        if (SUNRabs(SM_ELEMENT_B(Ab, i, j)) > droptol)
        {
          (SM_INDEXVALS_S(As))[nnz] = i;
          (SM_DATA_S(As))[nnz++]    = SM_ELEMENT_B(Ab, i, j);
        }
      }
    }
    (SM_INDEXPTRS_S(As))[N] = nnz;
  }
  else
  { /* CSR_MAT */
    for (i = 0; i < M; i++)
    {
      (SM_INDEXPTRS_S(As))[i] = nnz;
      for (j = SUNMAX(0, i - SM_LBAND_B(Ab));
           j <= SUNMIN(N - 1, i + SM_UBAND_B(Ab)); j++)
      {
        if (SUNRabs(SM_ELEMENT_B(Ab, i, j)) > droptol)
        {
          (SM_INDEXVALS_S(As))[nnz] = j;
          (SM_DATA_S(As))[nnz++]    = SM_ELEMENT_B(Ab, i, j);
        }
      }
    }
    (SM_INDEXPTRS_S(As))[M] = nnz;
  }

  return (As);
}